

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateMessageHeader
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FieldDescriptor **ppFVar5;
  FieldGenerator *pFVar6;
  FieldDescriptor *pFVar7;
  OneofDescriptor *pOVar8;
  char *pcVar9;
  reference pvVar10;
  reference ppOVar11;
  reference ppOVar12;
  reference ppEVar13;
  reference ppMVar14;
  undefined1 prefer_single_line;
  string *value;
  int __c;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_158;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_150;
  iterator iter_4;
  __normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
  local_140;
  iterator iter_3;
  __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
  local_130;
  iterator iter_2;
  int i_2;
  int oneof_index;
  FieldDescriptor *field;
  int i_1;
  vector<char,_std::allocator<char>_> seen_oneofs;
  undefined1 local_d8 [8];
  SourceLocation location;
  string message_comments;
  __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
  local_48;
  iterator iter_1;
  int i;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_30;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_20;
  iterator iter;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  iter._M_current = (MessageGenerator **)printer;
  bVar1 = IsMapEntryMessage(this->descriptor_);
  if (bVar1) {
    local_20._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
         ::begin(&this->nested_message_generators_);
    while( true ) {
      sorted_fields.array_ =
           (FieldDescriptor **)
           std::
           vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
           ::end(&this->nested_message_generators_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_20,
                         (__normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
                          *)&sorted_fields);
      if (!bVar1) break;
      ppMVar14 = __gnu_cxx::
                 __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
                 ::operator*(&local_20);
      GenerateMessageHeader(*ppMVar14,(Printer *)iter._M_current);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
      ::operator++(&local_20);
    }
  }
  else {
    value = &this->class_name_;
    io::Printer::Print((Printer *)iter._M_current,"#pragma mark - $classname$\n\n","classname",value
                      );
    iVar2 = Descriptor::field_count(this->descriptor_);
    if (iVar2 != 0) {
      ppFVar5 = anon_unknown_7::SortFieldsByNumber(this->descriptor_);
      internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array
                (&local_30,ppFVar5);
      io::Printer::Print((Printer *)iter._M_current,"typedef GPB_ENUM($classname$_FieldNumber) {\n",
                         "classname",&this->class_name_);
      io::Printer::Indent((Printer *)iter._M_current);
      iter_1._M_current._0_4_ = 0;
      while( true ) {
        iVar2 = (int)iter_1._M_current;
        uVar3 = Descriptor::field_count(this->descriptor_);
        value = (string *)(ulong)uVar3;
        if ((int)uVar3 <= iVar2) break;
        ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            (&local_30,(long)(int)iter_1._M_current);
        pFVar6 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar5);
        FieldGenerator::GenerateFieldNumberConstant(pFVar6,(Printer *)iter._M_current);
        iter_1._M_current._0_4_ = (int)iter_1._M_current + 1;
      }
      io::Printer::Outdent((Printer *)iter._M_current);
      io::Printer::Print((Printer *)iter._M_current,"};\n\n");
      internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&local_30);
    }
    local_48._M_current =
         (OneofGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
         ::begin(&this->oneof_generators_);
    while( true ) {
      message_comments.field_2._8_8_ =
           std::
           vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
           ::end(&this->oneof_generators_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_48,
                         (__normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
                          *)((long)&message_comments.field_2 + 8));
      prefer_single_line = SUB81(value,0);
      if (!bVar1) break;
      ppOVar12 = __gnu_cxx::
                 __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
                 ::operator*(&local_48);
      OneofGenerator::GenerateCaseEnum(*ppOVar12,(Printer *)iter._M_current);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
      ::operator++(&local_48);
    }
    std::__cxx11::string::string
              ((string *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SourceLocation::SourceLocation((SourceLocation *)local_d8);
    bVar1 = Descriptor::GetSourceLocation(this->descriptor_,(SourceLocation *)local_d8);
    if (bVar1) {
      BuildCommentsString_abi_cxx11_
                ((string *)
                 &seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 (objectivec *)local_d8,(SourceLocation *)0x0,(bool)prefer_single_line);
      std::__cxx11::string::operator=
                ((string *)
                 &location.leading_detached_comments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (string *)
                 &seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::__cxx11::string::~string
                ((string *)
                 &seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    }
    else {
      std::__cxx11::string::operator=
                ((string *)
                 &location.leading_detached_comments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
    }
    io::Printer::Print((Printer *)iter._M_current,
                       "$comments$$deprecated_attribute$@interface $classname$ : GPBMessage\n\n",
                       "classname",&this->class_name_,"deprecated_attribute",
                       &this->deprecated_attribute_,"comments",
                       (string *)
                       &location.leading_detached_comments.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar2 = Descriptor::oneof_decl_count(this->descriptor_);
    field._7_1_ = 0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&i_1,(long)iVar2,
               (value_type_conflict3 *)((long)&field + 7),(allocator_type *)((long)&field + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&field + 6));
    for (field._0_4_ = 0; uVar3 = (uint)field, iVar2 = Descriptor::field_count(this->descriptor_),
        (int)uVar3 < iVar2; field._0_4_ = (uint)field + 1) {
      pcVar9 = (char *)(ulong)(uint)field;
      pFVar7 = Descriptor::field(this->descriptor_,(uint)field);
      pOVar8 = FieldDescriptor::containing_oneof(pFVar7);
      if (pOVar8 != (OneofDescriptor *)0x0) {
        pOVar8 = FieldDescriptor::containing_oneof(pFVar7);
        pcVar9 = OneofDescriptor::index(pOVar8,pcVar9,__c);
        iter_2._M_current._4_4_ = (int)pcVar9;
        pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)&i_1,
                             (long)iter_2._M_current._4_4_);
        if (*pvVar10 == '\0') {
          pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)&i_1,
                               (long)iter_2._M_current._4_4_);
          *pvVar10 = '\x01';
          ppOVar11 = std::
                     vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                     ::operator[](&this->oneof_generators_,(long)iter_2._M_current._4_4_);
          OneofGenerator::GeneratePublicCasePropertyDeclaration
                    (*ppOVar11,(Printer *)iter._M_current);
        }
      }
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar7);
      (*pFVar6->_vptr_FieldGenerator[3])(pFVar6,iter._M_current);
    }
    io::Printer::Print((Printer *)iter._M_current,"@end\n\n");
    for (iter_2._M_current._0_4_ = 0; iVar2 = (int)iter_2._M_current,
        iVar4 = Descriptor::field_count(this->descriptor_), iVar2 < iVar4;
        iter_2._M_current._0_4_ = (int)iter_2._M_current + 1) {
      pFVar7 = Descriptor::field(this->descriptor_,(int)iter_2._M_current);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar7);
      (*pFVar6->_vptr_FieldGenerator[5])(pFVar6,iter._M_current);
    }
    bVar1 = std::
            vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
            ::empty(&this->oneof_generators_);
    if (!bVar1) {
      local_130._M_current =
           (OneofGenerator **)
           std::
           vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
           ::begin(&this->oneof_generators_);
      while( true ) {
        iter_3._M_current =
             (ExtensionGenerator **)
             std::
             vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
             ::end(&this->oneof_generators_);
        bVar1 = __gnu_cxx::operator!=
                          (&local_130,
                           (__normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
                            *)&iter_3);
        if (!bVar1) break;
        ppOVar12 = __gnu_cxx::
                   __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
                   ::operator*(&local_130);
        OneofGenerator::GenerateClearFunctionDeclaration(*ppOVar12,(Printer *)iter._M_current);
        __gnu_cxx::
        __normal_iterator<google::protobuf::compiler::objectivec::OneofGenerator_**,_std::vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>_>
        ::operator++(&local_130);
      }
      io::Printer::Print((Printer *)iter._M_current,"\n");
    }
    iVar2 = Descriptor::extension_count(this->descriptor_);
    if (0 < iVar2) {
      io::Printer::Print((Printer *)iter._M_current,"@interface $classname$ (DynamicMethods)\n\n",
                         "classname",&this->class_name_);
      local_140._M_current =
           (ExtensionGenerator **)
           std::
           vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
           ::begin(&this->extension_generators_);
      while( true ) {
        iter_4._M_current =
             (MessageGenerator **)
             std::
             vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
             ::end(&this->extension_generators_);
        bVar1 = __gnu_cxx::operator!=
                          (&local_140,
                           (__normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
                            *)&iter_4);
        if (!bVar1) break;
        ppEVar13 = __gnu_cxx::
                   __normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
                   ::operator*(&local_140);
        ExtensionGenerator::GenerateMembersHeader(*ppEVar13,(Printer *)iter._M_current);
        __gnu_cxx::
        __normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
        ::operator++(&local_140);
      }
      io::Printer::Print((Printer *)iter._M_current,"@end\n\n");
    }
    local_150._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
         ::begin(&this->nested_message_generators_);
    while( true ) {
      local_158._M_current =
           (MessageGenerator **)
           std::
           vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
           ::end(&this->nested_message_generators_);
      bVar1 = __gnu_cxx::operator!=(&local_150,&local_158);
      if (!bVar1) break;
      ppMVar14 = __gnu_cxx::
                 __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
                 ::operator*(&local_150);
      GenerateMessageHeader(*ppMVar14,(Printer *)iter._M_current);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
      ::operator++(&local_150);
    }
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&i_1);
    SourceLocation::~SourceLocation((SourceLocation *)local_d8);
    std::__cxx11::string::~string
              ((string *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateMessageHeader(io::Printer* printer) {
  // This a a map entry message, just recurse and do nothing directly.
  if (IsMapEntryMessage(descriptor_)) {
    for (vector<MessageGenerator*>::iterator iter =
             nested_message_generators_.begin();
         iter != nested_message_generators_.end(); ++iter) {
      (*iter)->GenerateMessageHeader(printer);
    }
    return;
  }

  printer->Print(
      "#pragma mark - $classname$\n"
      "\n",
      "classname", class_name_);

  if (descriptor_->field_count()) {
    scoped_array<const FieldDescriptor*> sorted_fields(
        SortFieldsByNumber(descriptor_));

    printer->Print("typedef GPB_ENUM($classname$_FieldNumber) {\n",
                   "classname", class_name_);
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(sorted_fields[i])
          .GenerateFieldNumberConstant(printer);
    }

    printer->Outdent();
    printer->Print("};\n\n");
  }

  for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
       iter != oneof_generators_.end(); ++iter) {
    (*iter)->GenerateCaseEnum(printer);
  }

  string message_comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    message_comments = BuildCommentsString(location, false);
  } else {
    message_comments = "";
  }

  printer->Print(
      "$comments$$deprecated_attribute$@interface $classname$ : GPBMessage\n\n",
      "classname", class_name_,
      "deprecated_attribute", deprecated_attribute_,
      "comments", message_comments);

  vector<char> seen_oneofs(descriptor_->oneof_decl_count(), 0);
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() != NULL) {
      const int oneof_index = field->containing_oneof()->index();
      if (!seen_oneofs[oneof_index]) {
        seen_oneofs[oneof_index] = 1;
        oneof_generators_[oneof_index]->GeneratePublicCasePropertyDeclaration(
            printer);
      }
    }
    field_generators_.get(field).GeneratePropertyDeclaration(printer);
  }

  printer->Print("@end\n\n");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateCFunctionDeclarations(printer);
  }

  if (!oneof_generators_.empty()) {
    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->GenerateClearFunctionDeclaration(printer);
    }
    printer->Print("\n");
  }

  if (descriptor_->extension_count() > 0) {
    printer->Print("@interface $classname$ (DynamicMethods)\n\n",
                   "classname", class_name_);
    for (vector<ExtensionGenerator*>::iterator iter =
             extension_generators_.begin();
         iter != extension_generators_.end(); ++iter) {
      (*iter)->GenerateMembersHeader(printer);
    }
    printer->Print("@end\n\n");
  }

  for (vector<MessageGenerator*>::iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    (*iter)->GenerateMessageHeader(printer);
  }
}